

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O0

uint __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
CheckDisposedObjectFreeBitVector(SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  uint bitIndex_00;
  SmallHeapBlockBitVector *this_00;
  undefined4 *puVar5;
  SmallHeapBlockBitVector *this_01;
  uint bitIndex;
  SmallHeapBlockBitVector *free;
  FreeObject *freeObject;
  uint verifyFreeCount;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  freeObject._4_4_ = 0;
  free = (SmallHeapBlockBitVector *)this->disposedObjectList;
  if (free != (SmallHeapBlockBitVector *)0x0) {
    this_00 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetFreeBitVector
                        ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this);
    while( true ) {
      uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAddressBitIndex(free);
      bitIndex_00 = (uint)uVar4;
      bVar2 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsValidBitIndex
                        ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,bitIndex_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                           ,0x279,"(this->IsValidBitIndex(bitIndex))",
                           "this->IsValidBitIndex(bitIndex)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_01 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetDebugFreeBitVector
                          ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this);
      BVar3 = BVStatic<2048UL>::Test(this_01,bitIndex_00);
      if (BVar3 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                           ,0x27a,"(!this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "!this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      BVar3 = BVStatic<2048UL>::Test(this_00,bitIndex_00);
      if (BVar3 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                           ,0x27b,"(free->Test(bitIndex))","free->Test(bitIndex)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      freeObject._4_4_ = freeObject._4_4_ + 1;
      if (free == (SmallHeapBlockBitVector *)this->disposedObjectListTail) break;
      free = (SmallHeapBlockBitVector *)FreeObject::GetNext((FreeObject *)free);
    }
  }
  return freeObject._4_4_;
}

Assistant:

uint
SmallFinalizableHeapBlockT<TBlockAttributes>::CheckDisposedObjectFreeBitVector()
{
    uint verifyFreeCount = 0;
    // all the finalized object are considered freed, but not allocable yet
    FreeObject *freeObject = this->disposedObjectList;
    if (freeObject != nullptr)
    {
        SmallHeapBlockBitVector * free = this->GetFreeBitVector();
        while (true)
        {
            uint bitIndex = this->GetAddressBitIndex(freeObject);
            Assert(this->IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;

            if (freeObject == this->disposedObjectListTail)
            {
                break;
            }
            freeObject = freeObject->GetNext();
        }
    }
    return verifyFreeCount;
}